

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators_test.cpp
# Opt level: O2

void __thiscall RenderTest::~RenderTest(RenderTest *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

TEST_P(RenderTest, RadianceMatches) {
    const TestIntegrator &tr = GetParam();
    tr.integrator->Render();
    CheckSceneAverage(inTestDir("test.exr"), tr.scene.expected);
    // The SpatialLightSampler class keeps a per-thread cache that
    // must be cleared out between test runs. In turn, this means that we
    // must delete the Integrator here in order to make sure that its
    // destructor runs. (This is ugly and should be fixed in a better way.)
    delete tr.integrator;

    EXPECT_EQ(0, remove(inTestDir("test.exr").c_str()));
}